

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_integer_width_for_instruction(CompilerGLSL *this,Instruction *instr)

{
  uint32_t *puVar1;
  SPIRType *pSVar2;
  uint32_t uVar3;
  
  uVar3 = 0x20;
  if (2 < instr->length) {
    puVar1 = Compiler::stream(&this->super_Compiler,instr);
    if ((instr->op - 0xaa < 10) || (instr->op - 0x6f < 4)) {
      pSVar2 = Compiler::expression_type(&this->super_Compiler,puVar1[2]);
    }
    else {
      pSVar2 = Compiler::maybe_get<spirv_cross::SPIRType>(&this->super_Compiler,*puVar1);
      if (pSVar2 == (SPIRType *)0x0) {
        return 0x20;
      }
      if (7 < *(int *)&(pSVar2->super_IVariant).field_0xc - 3U) {
        return 0x20;
      }
    }
    uVar3 = pSVar2->width;
  }
  return uVar3;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_instruction(const Instruction &instr) const
{
	if (instr.length < 3)
		return 32;

	auto *ops = stream(instr);

	switch (instr.op)
	{
	case OpSConvert:
	case OpConvertSToF:
	case OpUConvert:
	case OpConvertUToF:
	case OpIEqual:
	case OpINotEqual:
	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
		return expression_type(ops[2]).width;

	default:
	{
		// We can look at result type which is more robust.
		auto *type = maybe_get<SPIRType>(ops[0]);
		if (type && type_is_integral(*type))
			return type->width;
		else
			return 32;
	}
	}
}